

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::PaddingLayerParams::PaddingLayerParams
          (PaddingLayerParams *this,PaddingLayerParams *from)

{
  uint32 uVar1;
  void *pvVar2;
  BorderAmounts *from_00;
  BorderAmounts *this_00;
  PaddingLayerParams_PaddingConstant *this_01;
  PaddingLayerParams_PaddingConstant *from_01;
  PaddingLayerParams_PaddingReflection *this_02;
  PaddingLayerParams_PaddingReflection *from_02;
  PaddingLayerParams_PaddingReplication *this_03;
  PaddingLayerParams_PaddingReplication *from_03;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__PaddingLayerParams_00396588;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  from_00 = from->paddingamounts_;
  if (from_00 == (BorderAmounts *)0x0 ||
      from == (PaddingLayerParams *)&_PaddingLayerParams_default_instance_) {
    this_00 = (BorderAmounts *)0x0;
  }
  else {
    this_00 = (BorderAmounts *)operator_new(0x30);
    BorderAmounts::BorderAmounts(this_00,from_00);
  }
  this->paddingamounts_ = this_00;
  this->_oneof_case_[0] = 0;
  uVar1 = from->_oneof_case_[0];
  if (uVar1 == 3) {
    this_03 = mutable_replication(this);
    from_03 = replication(from);
    PaddingLayerParams_PaddingReplication::MergeFrom(this_03,from_03);
  }
  else if (uVar1 == 2) {
    this_02 = mutable_reflection(this);
    from_02 = reflection(from);
    PaddingLayerParams_PaddingReflection::MergeFrom(this_02,from_02);
  }
  else if (uVar1 == 1) {
    this_01 = mutable_constant(this);
    from_01 = constant(from);
    PaddingLayerParams_PaddingConstant::MergeFrom(this_01,from_01);
  }
  return;
}

Assistant:

PaddingLayerParams::PaddingLayerParams(const PaddingLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_paddingamounts()) {
    paddingamounts_ = new ::CoreML::Specification::BorderAmounts(*from.paddingamounts_);
  } else {
    paddingamounts_ = NULL;
  }
  clear_has_PaddingType();
  switch (from.PaddingType_case()) {
    case kConstant: {
      mutable_constant()->::CoreML::Specification::PaddingLayerParams_PaddingConstant::MergeFrom(from.constant());
      break;
    }
    case kReflection: {
      mutable_reflection()->::CoreML::Specification::PaddingLayerParams_PaddingReflection::MergeFrom(from.reflection());
      break;
    }
    case kReplication: {
      mutable_replication()->::CoreML::Specification::PaddingLayerParams_PaddingReplication::MergeFrom(from.replication());
      break;
    }
    case PADDINGTYPE_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.PaddingLayerParams)
}